

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_info.cpp
# Opt level: O2

string * __thiscall
duckdb::ParseInfo::TypeToString_abi_cxx11_
          (string *__return_storage_ptr__,ParseInfo *this,CatalogType type)

{
  int iVar1;
  InternalException *this_00;
  undefined7 in_register_00000011;
  char *pcVar2;
  allocator local_59;
  string local_58;
  string local_38;
  
  iVar1 = (int)this;
  switch(iVar1) {
  case 1:
    pcVar2 = "TABLE";
    break;
  case 2:
    pcVar2 = "SCHEMA";
    break;
  case 3:
    pcVar2 = "VIEW";
    break;
  case 4:
    pcVar2 = "INDEX";
    break;
  case 5:
  case 7:
switchD_0132e0dd_caseD_5:
    this_00 = (InternalException *)
              __cxa_allocate_exception(0x10,this,CONCAT71(in_register_00000011,type));
    ::std::__cxx11::string::string
              ((string *)&local_58,
               "ParseInfo::TypeToString for CatalogType with type: %s not implemented",&local_59);
    EnumUtil::ToString<duckdb::CatalogType>(&local_38,(CatalogType)this);
    InternalException::InternalException<std::__cxx11::string>(this_00,&local_58,&local_38);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case 6:
    pcVar2 = "SEQUENCE";
    break;
  case 8:
    pcVar2 = "TYPE";
    break;
  default:
    if (iVar1 == 0x1a) {
      pcVar2 = "FUNCTION";
    }
    else if (iVar1 == 0x1e) {
      pcVar2 = "MACRO";
    }
    else if (iVar1 == 0x1f) {
      pcVar2 = "MACRO TABLE";
    }
    else {
      if (iVar1 != 0x47) goto switchD_0132e0dd_caseD_5;
      pcVar2 = "SECRET";
    }
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,(allocator *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

string ParseInfo::TypeToString(CatalogType type) {
	switch (type) {
	case CatalogType::TABLE_ENTRY:
		return "TABLE";
	case CatalogType::SCALAR_FUNCTION_ENTRY:
		return "FUNCTION";
	case CatalogType::INDEX_ENTRY:
		return "INDEX";
	case CatalogType::SCHEMA_ENTRY:
		return "SCHEMA";
	case CatalogType::TYPE_ENTRY:
		return "TYPE";
	case CatalogType::VIEW_ENTRY:
		return "VIEW";
	case CatalogType::SEQUENCE_ENTRY:
		return "SEQUENCE";
	case CatalogType::MACRO_ENTRY:
		return "MACRO";
	case CatalogType::TABLE_MACRO_ENTRY:
		return "MACRO TABLE";
	case CatalogType::SECRET_ENTRY:
		return "SECRET";
	default:
		throw InternalException("ParseInfo::TypeToString for CatalogType with type: %s not implemented",
		                        EnumUtil::ToString(type));
	}
}